

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O0

void ModuleEntry(Environment *env)

{
  unsigned_long uVar1;
  ostream *this;
  undefined8 extraout_RDX;
  Word WVar2;
  allocator<char> local_41;
  string local_40 [32];
  undefined2 local_20;
  Word helloword;
  Environment *env_local;
  
  helloword.minor = (unsigned_long)env;
  this = std::operator<<((ostream *)&std::cout,"Std library loaded");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  uVar1 = helloword.minor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"hello",&local_41);
  local_20 = huelang::DefinitionTable::TokToWord(uVar1,local_40);
  helloword._0_8_ = extraout_RDX;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  WVar2.minor._0_2_ = local_20;
  WVar2._0_8_ = helloword.minor;
  WVar2.minor._2_6_ = 0;
  huelang::Environment::AddPrimaryDefinition(WVar2,(_func_void_Environment_ptr *)helloword._0_8_);
  return;
}

Assistant:

void ModuleEntry(Environment *env) {
    cout << "Std library loaded" << endl;
    Word helloword = env->definitionTable.TokToWord("hello");
    env->AddPrimaryDefinition(helloword, &__hello);
}